

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O0

int __thiscall miniros::network::HttpFrame::incrementalParse(HttpFrame *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long in_RDI;
  int bytesParsed;
  int position;
  Field field;
  char *namePtr;
  char *tokenStart;
  char *cp;
  char *end;
  char *start;
  value_type *in_stack_fffffffffffffec8;
  Field *in_stack_fffffffffffffed0;
  allocator local_c1;
  string local_c0 [35];
  allocator local_9d [13];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  long local_10;
  
  lVar4 = std::__cxx11::string::c_str();
  local_10 = lVar4;
  lVar5 = std::__cxx11::string::length();
  local_18 = (char *)(lVar4 + lVar5);
  local_20 = (char *)(local_10 + *(int *)(in_RDI + 0x50));
  local_28 = (char *)(local_10 + *(int *)(in_RDI + 0x5c));
LAB_00456366:
  do {
    if (local_18 <= local_20) {
LAB_004568fc:
      *(int *)(in_RDI + 0x5c) = (int)local_28 - (int)local_10;
      if (*(int *)(in_RDI + 0x70) == 3) {
        if (*(int *)(in_RDI + 0x60) < 0) {
          *(undefined4 *)(in_RDI + 0x70) = 4;
          *(undefined4 *)(in_RDI + 0x58) = *(undefined4 *)(in_RDI + 0x54);
          local_20 = (char *)(local_10 + *(int *)(in_RDI + 0x58));
        }
        else {
          iVar3 = *(int *)(in_RDI + 0x54);
          iVar8 = *(int *)(in_RDI + 0x60);
          uVar7 = std::__cxx11::string::length();
          if (uVar7 < (ulong)(long)(iVar3 + iVar8)) {
            lVar4 = local_10;
            lVar5 = std::__cxx11::string::length();
            local_20 = (char *)(lVar4 + lVar5);
          }
          else {
            *(undefined4 *)(in_RDI + 0x70) = 4;
            *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x54) + *(int *)(in_RDI + 0x60);
            local_20 = (char *)(local_10 + *(int *)(in_RDI + 0x58));
          }
        }
      }
      iVar8 = (int)local_20 - (int)local_10;
      iVar3 = *(int *)(in_RDI + 0x50);
      *(int *)(in_RDI + 0x50) = iVar8;
      return iVar8 - iVar3;
    }
    if (*(int *)(in_RDI + 0x70) != 0) {
      if (*(int *)(in_RDI + 0x70) == 1) {
        if (*local_20 == ':') {
          *(undefined4 *)(in_RDI + 0x70) = 2;
          Token::assign((Token *)(in_RDI + 0x68),(int)local_28 - (int)local_10,
                        (int)local_20 - (int)local_10);
          local_28 = local_20 + 1;
          local_20 = local_28;
          goto LAB_00456366;
        }
        iVar3 = strncmp(local_20,"\n\n",2);
        if ((iVar3 == 0) || (iVar3 = strncmp(local_20,"\r\n",2), iVar3 == 0)) {
          *(undefined4 *)(in_RDI + 0x70) = 3;
          local_28 = local_20 + 2;
          *(int *)(in_RDI + 0x54) = (int)local_28 - (int)local_10;
          local_20 = local_28;
          goto LAB_004568fc;
        }
      }
      else {
        if (*(int *)(in_RDI + 0x70) != 2) goto LAB_004568fc;
        iVar3 = strncmp(local_20,"\r\n",2);
        if (iVar3 == 0) {
          local_30 = (char *)(local_10 + *(int *)(in_RDI + 0x68));
          iVar3 = strncasecmp(local_30,"Content-length",0xe);
          if (iVar3 == 0) {
            iVar3 = atoi(local_28);
            *(int *)(in_RDI + 0x60) = iVar3;
          }
          else {
            iVar3 = strncasecmp(local_30,"Connection",10);
            if (iVar3 == 0) {
              iVar3 = strncasecmp(local_28,"keep-alive",10);
              if (iVar3 == 0) {
                *(undefined1 *)(in_RDI + 100) = 1;
              }
              else {
                iVar3 = strncasecmp(local_28,"close",5);
                if (iVar3 == 0) {
                  *(undefined1 *)(in_RDI + 100) = 0;
                }
              }
            }
            else {
              Field::Field(in_stack_fffffffffffffed0);
              pcVar1 = local_30;
              sVar6 = Token::size((Token *)(in_RDI + 0x68));
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_90,pcVar1,sVar6,local_9d);
              std::__cxx11::string::operator=(local_70,local_90);
              std::__cxx11::string::~string(local_90);
              std::allocator<char>::~allocator((allocator<char> *)local_9d);
              pcVar1 = local_28;
              uVar7 = (long)local_20 - (long)local_28;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_c0,pcVar1,uVar7,&local_c1);
              std::__cxx11::string::operator=(local_50,local_c0);
              std::__cxx11::string::~string(local_c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              std::
              vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
              ::push_back((vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>
                           *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
              Field::~Field(in_stack_fffffffffffffed0);
            }
          }
          local_28 = local_20 + 2;
          *(undefined4 *)(in_RDI + 0x70) = 1;
          local_20 = local_28;
          goto LAB_00456366;
        }
      }
LAB_004568e3:
      local_20 = local_20 + 1;
      goto LAB_00456366;
    }
    iVar3 = strncmp(local_20,"\r\n",2);
    if (iVar3 != 0) {
      bVar2 = Token::empty((Token *)(in_RDI + 0x20));
      if ((bVar2) && (*local_20 == ' ')) {
        Token::assign((Token *)(in_RDI + 0x20),(int)local_28 - (int)local_10,
                      (int)local_20 - (int)local_10);
        local_28 = local_20 + 1;
      }
      else {
        bVar2 = Token::empty((Token *)(in_RDI + 0x28));
        if ((bVar2) && (*local_20 == ' ')) {
          Token::assign((Token *)(in_RDI + 0x28),(int)local_28 - (int)local_10,
                        (int)local_20 - (int)local_10);
          local_28 = local_20 + 1;
        }
      }
      goto LAB_004568e3;
    }
    Token::assign((Token *)(in_RDI + 0x30),(int)local_28 - (int)local_10,
                  (int)local_20 - (int)local_10);
    local_28 = local_20 + 2;
    *(undefined4 *)(in_RDI + 0x70) = 1;
    local_20 = local_28;
  } while( true );
}

Assistant:

int HttpFrame::incrementalParse()
{
  const char *start = data.c_str();
  const char *end = start + data.length();
  const char* cp = start + m_currentPosition;

  const char* tokenStart = start + m_tokenStart;

  for (; cp < end;) {
    if (m_state == HttpFrame::ParseRequest) {
      if (strncmp(cp, "\r\n", 2) == 0) {
        requestHttpVersion.assign(tokenStart - start, cp - start);
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      } if (requestType.empty() && *cp == ' ') {
        requestType.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else if (requestUrl.empty() && *cp == ' ') {
        requestUrl.assign(tokenStart - start, cp - start);
        tokenStart = cp + 1;
      } else {
        // Error?
      }
    }
    else if (m_state == HttpFrame::ParseFieldName) {
      if (*cp == ':') {
        m_state = HttpFrame::ParseFieldValue;
        m_fieldName.assign(tokenStart - start, cp - start);
        cp++;
        tokenStart = cp;
        continue;
      }

      if (strncmp(cp, "\n\n", 2) == 0 || strncmp(cp, "\r\n", 2) == 0) {
        m_state = HttpFrame::ParseBody;
        cp += 2;
        tokenStart = cp;
        m_bodyPosition = cp - start;
        break;
      }
    } else if (m_state == HttpFrame::ParseFieldValue) {
      assert(tokenStart != nullptr);
      if (strncmp(cp, "\r\n", 2) == 0) {
        const char* namePtr = start + m_fieldName.start;
        if (strncasecmp(namePtr, "Content-length", 14) == 0)  {
          m_contentLength = atoi(tokenStart);
        } else if (strncasecmp(namePtr, "Connection", 10) == 0) {
          if (strncasecmp(tokenStart, "keep-alive", 10) == 0) {
            m_keepAlive = true;
          } else if (strncasecmp(tokenStart, "close", 5) == 0) {
            m_keepAlive = false;
          }
        } else {
          Field field;
          field.name = std::string(namePtr, m_fieldName.size());
          field.value = std::string(tokenStart, cp - tokenStart);
          fields.push_back(std::move(field));
        }
        cp += 2;
        tokenStart = cp;
        m_state = HttpFrame::ParseFieldName;
        continue;
      }
    } else // Any other state.
      break;
    cp++;
  }
  m_tokenStart = tokenStart - start;

  if (m_state == HttpFrame::ParseBody) {
    if (m_contentLength >= 0) {
      // Need body and got all the data.
      if (m_bodyPosition + m_contentLength <= data.length()) {
        m_state = HttpFrame::ParseComplete;
        m_bodyEnd = m_bodyPosition + m_contentLength;
        cp = start + m_bodyEnd;
      } else {
        // `data` does not contain full body yet, but need to advance `cp`.
        cp = start + data.length();
      }
    } else {
      m_state = HttpFrame::ParseComplete;
      m_bodyEnd = m_bodyPosition;
      cp = start + m_bodyEnd;
    }
  }

  int position = cp - start;
  int bytesParsed = position - m_currentPosition;
  m_currentPosition = position;

  return bytesParsed;
}